

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_reader.hpp
# Opt level: O2

uint32_t __thiscall
duckdb::ByteReader::ReadValue<unsigned_int>(ByteReader *this,uint8_t bytes,uint8_t trailing_zero)

{
  uint uVar1;
  uint uVar2;
  InternalException *this_00;
  uint32_t uVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  allocator local_41;
  string local_40;
  
  uVar4 = CONCAT71(in_register_00000031,bytes) & 0xffffffff;
  switch(uVar4) {
  case 0:
    if (7 < trailing_zero) {
      return 0;
    }
  case 4:
    uVar2 = *(uint *)(this->buffer + this->index);
    uVar3 = this->index + 4;
    break;
  case 1:
    uVar2 = (uint)this->buffer[this->index];
    uVar3 = this->index + 1;
    break;
  case 2:
    uVar2 = (uint)*(ushort *)(this->buffer + this->index);
    uVar3 = this->index + 2;
    break;
  case 3:
    uVar1 = this->index;
    uVar2 = (uint)CONCAT12(this->buffer[(ulong)uVar1 + 2],*(undefined2 *)(this->buffer + uVar1));
    uVar3 = uVar1 + 3;
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,
               "Write of %llu bytes attempted into address pointing to 4 byte value",&local_41);
    InternalException::InternalException<unsigned_char>(this_00,&local_40,(uchar)uVar4);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->index = uVar3;
  return uVar2;
}

Assistant:

inline uint32_t ByteReader::ReadValue(uint8_t bytes, uint8_t trailing_zero) {
	uint32_t result = 0;
	switch (bytes) {
	case 0:
		// LCOV_EXCL_START
		if (trailing_zero < 8) {
			result = Load<uint32_t>(buffer + index);
			index += sizeof(uint32_t);
			return result;
		}
		return result;
	case 1:
		result = Load<uint8_t>(buffer + index);
		index++;
		return result;
	case 2:
		result = Load<uint16_t>(buffer + index);
		index += 2;
		return result;
	case 3:
		memcpy(&result, (void *)(buffer + index), 3);
		index += 3;
		return result;
	case 4:
		result = Load<uint32_t>(buffer + index);
		index += 4;
		return result;
		// LCOV_EXCL_STOP
	default:
		throw InternalException("Write of %llu bytes attempted into address pointing to 4 byte value", bytes);
	}
}